

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool __thiscall
llvm::ItaniumPartialDemangler::partialDemangle(ItaniumPartialDemangler *this,char *MangledName)

{
  Db *this_00;
  size_t sVar1;
  Node *pNVar2;
  size_t Len;
  Db *Parser;
  char *MangledName_local;
  ItaniumPartialDemangler *this_local;
  
  this_00 = (Db *)this->Context;
  sVar1 = strlen(MangledName);
  anon_unknown.dwarf_2f151d::Db::reset(this_00,MangledName,MangledName + sVar1);
  pNVar2 = anon_unknown.dwarf_2f151d::Db::parse(this_00);
  this->RootNode = pNVar2;
  return this->RootNode == (void *)0x0;
}

Assistant:

bool ItaniumPartialDemangler::partialDemangle(const char *MangledName) {
  Db *Parser = static_cast<Db *>(Context);
  size_t Len = std::strlen(MangledName);
  Parser->reset(MangledName, MangledName + Len);
  RootNode = Parser->parse();
  return RootNode == nullptr;
}